

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSCriticalSection.h
# Opt level: O0

void DeleteCriticalSection(CRITICAL_SECTION *pCriticalSection)

{
  CRITICAL_SECTION *pCriticalSection_local;
  
  pthread_mutex_destroy((pthread_mutex_t *)pCriticalSection);
  return;
}

Assistant:

inline void DeleteCriticalSection(CRITICAL_SECTION* pCriticalSection)
{
	if (pthread_mutex_destroy(pCriticalSection) != EXIT_SUCCESS)
	{
		PRINT_DEBUG_WARNING_OSCRITICALSECTION(("DeleteCriticalSection warning (%s) : %s"
			"(pCriticalSection=%#x)\n", 
			strtime_m(), 
			"pthread_mutex_destroy failed. ", 
			pCriticalSection));
	}
}